

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageCracker.h
# Opt level: O3

void __thiscall
FIX50::MessageCracker::crack(MessageCracker *this,Message *message,SessionID *sessionID)

{
  int iVar1;
  FieldBase *pFVar2;
  code *UNRECOVERED_JUMPTABLE;
  string *psVar3;
  
  pFVar2 = FIX::FieldMap::getFieldRef((FieldMap *)&message->field_0x70,0x23);
  psVar3 = &pFVar2->m_string;
  iVar1 = std::__cxx11::string::compare((char *)psVar3);
  if (iVar1 == 0) {
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x20);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)psVar3);
    if (iVar1 == 0) {
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x28);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)psVar3);
      if (iVar1 == 0) {
        UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x30);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)psVar3);
        if (iVar1 == 0) {
          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x38);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)psVar3);
          if (iVar1 == 0) {
            UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x40);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)psVar3);
            if (iVar1 == 0) {
              UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x48);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)psVar3);
              if (iVar1 == 0) {
                UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x50);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)psVar3);
                if (iVar1 == 0) {
                  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x58);
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)psVar3);
                  if (iVar1 == 0) {
                    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x60);
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)psVar3);
                    if (iVar1 == 0) {
                      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x68);
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)psVar3);
                      if (iVar1 == 0) {
                        UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x70);
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)psVar3);
                        if (iVar1 == 0) {
                          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x78);
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)psVar3);
                          if (iVar1 == 0) {
                            UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x80);
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)psVar3);
                            if (iVar1 == 0) {
                              UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x88);
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)psVar3);
                              if (iVar1 == 0) {
                                UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x90);
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                if (iVar1 == 0) {
                                  UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0x98);
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                  if (iVar1 == 0) {
                                    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0xa0);
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                    if (iVar1 == 0) {
                                      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0xa8);
                                    }
                                    else {
                                      iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                      if (iVar1 == 0) {
                                        UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0xb0);
                                      }
                                      else {
                                        iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                        if (iVar1 == 0) {
                                          UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0xb8);
                                        }
                                        else {
                                          iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                          if (iVar1 == 0) {
                                            UNRECOVERED_JUMPTABLE = *(code **)(*(long *)this + 0xc0)
                                            ;
                                          }
                                          else {
                                            iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                            if (iVar1 == 0) {
                                              UNRECOVERED_JUMPTABLE =
                                                   *(code **)(*(long *)this + 200);
                                            }
                                            else {
                                              iVar1 = std::__cxx11::string::compare((char *)psVar3);
                                              if (iVar1 == 0) {
                                                UNRECOVERED_JUMPTABLE =
                                                     *(code **)(*(long *)this + 0xd0);
                                              }
                                              else {
                                                iVar1 = std::__cxx11::string::compare
                                                                  ((char *)psVar3);
                                                if (iVar1 == 0) {
                                                  UNRECOVERED_JUMPTABLE =
                                                       *(code **)(*(long *)this + 0xd8);
                                                }
                                                else {
                                                  iVar1 = std::__cxx11::string::compare
                                                                    ((char *)psVar3);
                                                  if (iVar1 == 0) {
                                                    UNRECOVERED_JUMPTABLE =
                                                         *(code **)(*(long *)this + 0xe0);
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           *(code **)(*(long *)this + 0xe8);
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             *(code **)(*(long *)this + 0xf0);
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               *(code **)(*(long *)this + 0xf8);
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 *(code **)(*(long *)this + 0x100);
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   *(code **)(*(long *)this + 0x108)
                                                              ;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     *(code **)(*(long *)this +
                                                                               0x110);
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       *(code **)(*(long *)this +
                                                                                 0x118);
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         *(code **)(*(long *)this +
                                                                                   0x120);
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           *(code **)(*(long *)this
                                                                                     + 0x128);
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)psVar3
                                                                                     );
                                                                      if (iVar1 == 0) {
                                                                        UNRECOVERED_JUMPTABLE =
                                                                             *(code **)(*(long *)
                                                  this + 0x130);
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           *(code **)(*(long *)this + 0x138);
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             *(code **)(*(long *)this + 0x140);
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               *(code **)(*(long *)this + 0x148);
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 *(code **)(*(long *)this + 0x150);
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   *(code **)(*(long *)this + 0x158)
                                                              ;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     *(code **)(*(long *)this +
                                                                               0x160);
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       *(code **)(*(long *)this +
                                                                                 0x168);
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         *(code **)(*(long *)this +
                                                                                   0x170);
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           *(code **)(*(long *)this
                                                                                     + 0x178);
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)psVar3
                                                                                     );
                                                                      if (iVar1 == 0) {
                                                                        UNRECOVERED_JUMPTABLE =
                                                                             *(code **)(*(long *)
                                                  this + 0x180);
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           *(code **)(*(long *)this + 0x188);
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             *(code **)(*(long *)this + 400);
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               *(code **)(*(long *)this + 0x198);
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 *(code **)(*(long *)this + 0x1a0);
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   *(code **)(*(long *)this + 0x1a8)
                                                              ;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     *(code **)(*(long *)this +
                                                                               0x1b0);
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       *(code **)(*(long *)this +
                                                                                 0x1b8);
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         *(code **)(*(long *)this +
                                                                                   0x1c0);
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           *(code **)(*(long *)this
                                                                                     + 0x1c8);
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)psVar3
                                                                                     );
                                                                      if (iVar1 == 0) {
                                                                        UNRECOVERED_JUMPTABLE =
                                                                             *(code **)(*(long *)
                                                  this + 0x1d0);
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           *(code **)(*(long *)this + 0x1d8);
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             *(code **)(*(long *)this + 0x1e0);
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               *(code **)(*(long *)this + 0x1e8);
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 *(code **)(*(long *)this + 0x1f0);
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   *(code **)(*(long *)this + 0x1f8)
                                                              ;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     *(code **)(*(long *)this +
                                                                               0x200);
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       *(code **)(*(long *)this +
                                                                                 0x208);
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         *(code **)(*(long *)this +
                                                                                   0x210);
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           *(code **)(*(long *)this
                                                                                     + 0x218);
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)psVar3
                                                                                     );
                                                                      if (iVar1 == 0) {
                                                                        UNRECOVERED_JUMPTABLE =
                                                                             *(code **)(*(long *)
                                                  this + 0x220);
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           *(code **)(*(long *)this + 0x228);
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             *(code **)(*(long *)this + 0x230);
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               *(code **)(*(long *)this + 0x238);
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 *(code **)(*(long *)this + 0x240);
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   *(code **)(*(long *)this + 0x248)
                                                              ;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     *(code **)(*(long *)this +
                                                                               0x250);
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       *(code **)(*(long *)this +
                                                                                 600);
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         *(code **)(*(long *)this +
                                                                                   0x260);
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           *(code **)(*(long *)this
                                                                                     + 0x268);
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)psVar3
                                                                                     );
                                                                      if (iVar1 == 0) {
                                                                        UNRECOVERED_JUMPTABLE =
                                                                             *(code **)(*(long *)
                                                  this + 0x270);
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           *(code **)(*(long *)this + 0x278);
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             *(code **)(*(long *)this + 0x280);
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               *(code **)(*(long *)this + 0x288);
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 *(code **)(*(long *)this + 0x290);
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   *(code **)(*(long *)this + 0x298)
                                                              ;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     *(code **)(*(long *)this +
                                                                               0x2a0);
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       *(code **)(*(long *)this +
                                                                                 0x2a8);
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         *(code **)(*(long *)this +
                                                                                   0x2b0);
                                                                  }
                                                                  else {
                                                                    iVar1 = std::__cxx11::string::
                                                                            compare((char *)psVar3);
                                                                    if (iVar1 == 0) {
                                                                      UNRECOVERED_JUMPTABLE =
                                                                           *(code **)(*(long *)this
                                                                                     + 0x2b8);
                                                                    }
                                                                    else {
                                                                      iVar1 = std::__cxx11::string::
                                                                              compare((char *)psVar3
                                                                                     );
                                                                      if (iVar1 == 0) {
                                                                        UNRECOVERED_JUMPTABLE =
                                                                             *(code **)(*(long *)
                                                  this + 0x2c0);
                                                  }
                                                  else {
                                                    iVar1 = std::__cxx11::string::compare
                                                                      ((char *)psVar3);
                                                    if (iVar1 == 0) {
                                                      UNRECOVERED_JUMPTABLE =
                                                           *(code **)(*(long *)this + 0x2c8);
                                                    }
                                                    else {
                                                      iVar1 = std::__cxx11::string::compare
                                                                        ((char *)psVar3);
                                                      if (iVar1 == 0) {
                                                        UNRECOVERED_JUMPTABLE =
                                                             *(code **)(*(long *)this + 0x2d0);
                                                      }
                                                      else {
                                                        iVar1 = std::__cxx11::string::compare
                                                                          ((char *)psVar3);
                                                        if (iVar1 == 0) {
                                                          UNRECOVERED_JUMPTABLE =
                                                               *(code **)(*(long *)this + 0x2d8);
                                                        }
                                                        else {
                                                          iVar1 = std::__cxx11::string::compare
                                                                            ((char *)psVar3);
                                                          if (iVar1 == 0) {
                                                            UNRECOVERED_JUMPTABLE =
                                                                 *(code **)(*(long *)this + 0x2e0);
                                                          }
                                                          else {
                                                            iVar1 = std::__cxx11::string::compare
                                                                              ((char *)psVar3);
                                                            if (iVar1 == 0) {
                                                              UNRECOVERED_JUMPTABLE =
                                                                   *(code **)(*(long *)this + 0x2e8)
                                                              ;
                                                            }
                                                            else {
                                                              iVar1 = std::__cxx11::string::compare
                                                                                ((char *)psVar3);
                                                              if (iVar1 == 0) {
                                                                UNRECOVERED_JUMPTABLE =
                                                                     *(code **)(*(long *)this +
                                                                               0x2f0);
                                                              }
                                                              else {
                                                                iVar1 = std::__cxx11::string::
                                                                        compare((char *)psVar3);
                                                                if (iVar1 == 0) {
                                                                  UNRECOVERED_JUMPTABLE =
                                                                       *(code **)(*(long *)this +
                                                                                 0x2f8);
                                                                }
                                                                else {
                                                                  iVar1 = std::__cxx11::string::
                                                                          compare((char *)psVar3);
                                                                  if (iVar1 == 0) {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         *(code **)(*(long *)this +
                                                                                   0x300);
                                                                  }
                                                                  else {
                                                                    UNRECOVERED_JUMPTABLE =
                                                                         *(code **)(*(long *)this +
                                                                                   0x10);
                                                                  }
                                                                }
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  (*UNRECOVERED_JUMPTABLE)(this,message,sessionID);
  return;
}

Assistant:

void crack( const Message& message, 
              const FIX::SessionID& sessionID )
  {
    const std::string& msgTypeValue 
      = message.getHeader().getField( FIX::FIELD::MsgType );
    
    if( msgTypeValue == "6" )
      onMessage( (const IOI&)message, sessionID );
    else
    if( msgTypeValue == "7" )
      onMessage( (const Advertisement&)message, sessionID );
    else
    if( msgTypeValue == "8" )
      onMessage( (const ExecutionReport&)message, sessionID );
    else
    if( msgTypeValue == "9" )
      onMessage( (const OrderCancelReject&)message, sessionID );
    else
    if( msgTypeValue == "B" )
      onMessage( (const News&)message, sessionID );
    else
    if( msgTypeValue == "C" )
      onMessage( (const Email&)message, sessionID );
    else
    if( msgTypeValue == "D" )
      onMessage( (const NewOrderSingle&)message, sessionID );
    else
    if( msgTypeValue == "E" )
      onMessage( (const NewOrderList&)message, sessionID );
    else
    if( msgTypeValue == "F" )
      onMessage( (const OrderCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "G" )
      onMessage( (const OrderCancelReplaceRequest&)message, sessionID );
    else
    if( msgTypeValue == "H" )
      onMessage( (const OrderStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "J" )
      onMessage( (const AllocationInstruction&)message, sessionID );
    else
    if( msgTypeValue == "K" )
      onMessage( (const ListCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "L" )
      onMessage( (const ListExecute&)message, sessionID );
    else
    if( msgTypeValue == "M" )
      onMessage( (const ListStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "N" )
      onMessage( (const ListStatus&)message, sessionID );
    else
    if( msgTypeValue == "P" )
      onMessage( (const AllocationInstructionAck&)message, sessionID );
    else
    if( msgTypeValue == "Q" )
      onMessage( (const DontKnowTrade&)message, sessionID );
    else
    if( msgTypeValue == "R" )
      onMessage( (const QuoteRequest&)message, sessionID );
    else
    if( msgTypeValue == "S" )
      onMessage( (const Quote&)message, sessionID );
    else
    if( msgTypeValue == "T" )
      onMessage( (const SettlementInstructions&)message, sessionID );
    else
    if( msgTypeValue == "V" )
      onMessage( (const MarketDataRequest&)message, sessionID );
    else
    if( msgTypeValue == "W" )
      onMessage( (const MarketDataSnapshotFullRefresh&)message, sessionID );
    else
    if( msgTypeValue == "X" )
      onMessage( (const MarketDataIncrementalRefresh&)message, sessionID );
    else
    if( msgTypeValue == "Y" )
      onMessage( (const MarketDataRequestReject&)message, sessionID );
    else
    if( msgTypeValue == "Z" )
      onMessage( (const QuoteCancel&)message, sessionID );
    else
    if( msgTypeValue == "a" )
      onMessage( (const QuoteStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "b" )
      onMessage( (const MassQuoteAcknowledgement&)message, sessionID );
    else
    if( msgTypeValue == "c" )
      onMessage( (const SecurityDefinitionRequest&)message, sessionID );
    else
    if( msgTypeValue == "d" )
      onMessage( (const SecurityDefinition&)message, sessionID );
    else
    if( msgTypeValue == "e" )
      onMessage( (const SecurityStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "f" )
      onMessage( (const SecurityStatus&)message, sessionID );
    else
    if( msgTypeValue == "g" )
      onMessage( (const TradingSessionStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "h" )
      onMessage( (const TradingSessionStatus&)message, sessionID );
    else
    if( msgTypeValue == "i" )
      onMessage( (const MassQuote&)message, sessionID );
    else
    if( msgTypeValue == "j" )
      onMessage( (const BusinessMessageReject&)message, sessionID );
    else
    if( msgTypeValue == "k" )
      onMessage( (const BidRequest&)message, sessionID );
    else
    if( msgTypeValue == "l" )
      onMessage( (const BidResponse&)message, sessionID );
    else
    if( msgTypeValue == "m" )
      onMessage( (const ListStrikePrice&)message, sessionID );
    else
    if( msgTypeValue == "o" )
      onMessage( (const RegistrationInstructions&)message, sessionID );
    else
    if( msgTypeValue == "p" )
      onMessage( (const RegistrationInstructionsResponse&)message, sessionID );
    else
    if( msgTypeValue == "q" )
      onMessage( (const OrderMassCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "r" )
      onMessage( (const OrderMassCancelReport&)message, sessionID );
    else
    if( msgTypeValue == "s" )
      onMessage( (const NewOrderCross&)message, sessionID );
    else
    if( msgTypeValue == "t" )
      onMessage( (const CrossOrderCancelReplaceRequest&)message, sessionID );
    else
    if( msgTypeValue == "u" )
      onMessage( (const CrossOrderCancelRequest&)message, sessionID );
    else
    if( msgTypeValue == "v" )
      onMessage( (const SecurityTypeRequest&)message, sessionID );
    else
    if( msgTypeValue == "w" )
      onMessage( (const SecurityTypes&)message, sessionID );
    else
    if( msgTypeValue == "x" )
      onMessage( (const SecurityListRequest&)message, sessionID );
    else
    if( msgTypeValue == "y" )
      onMessage( (const SecurityList&)message, sessionID );
    else
    if( msgTypeValue == "z" )
      onMessage( (const DerivativeSecurityListRequest&)message, sessionID );
    else
    if( msgTypeValue == "AA" )
      onMessage( (const DerivativeSecurityList&)message, sessionID );
    else
    if( msgTypeValue == "AB" )
      onMessage( (const NewOrderMultileg&)message, sessionID );
    else
    if( msgTypeValue == "AC" )
      onMessage( (const MultilegOrderCancelReplace&)message, sessionID );
    else
    if( msgTypeValue == "AD" )
      onMessage( (const TradeCaptureReportRequest&)message, sessionID );
    else
    if( msgTypeValue == "AE" )
      onMessage( (const TradeCaptureReport&)message, sessionID );
    else
    if( msgTypeValue == "AF" )
      onMessage( (const OrderMassStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "AG" )
      onMessage( (const QuoteRequestReject&)message, sessionID );
    else
    if( msgTypeValue == "AH" )
      onMessage( (const RFQRequest&)message, sessionID );
    else
    if( msgTypeValue == "AI" )
      onMessage( (const QuoteStatusReport&)message, sessionID );
    else
    if( msgTypeValue == "AJ" )
      onMessage( (const QuoteResponse&)message, sessionID );
    else
    if( msgTypeValue == "AK" )
      onMessage( (const Confirmation&)message, sessionID );
    else
    if( msgTypeValue == "AL" )
      onMessage( (const PositionMaintenanceRequest&)message, sessionID );
    else
    if( msgTypeValue == "AM" )
      onMessage( (const PositionMaintenanceReport&)message, sessionID );
    else
    if( msgTypeValue == "AN" )
      onMessage( (const RequestForPositions&)message, sessionID );
    else
    if( msgTypeValue == "AO" )
      onMessage( (const RequestForPositionsAck&)message, sessionID );
    else
    if( msgTypeValue == "AP" )
      onMessage( (const PositionReport&)message, sessionID );
    else
    if( msgTypeValue == "AQ" )
      onMessage( (const TradeCaptureReportRequestAck&)message, sessionID );
    else
    if( msgTypeValue == "AR" )
      onMessage( (const TradeCaptureReportAck&)message, sessionID );
    else
    if( msgTypeValue == "AS" )
      onMessage( (const AllocationReport&)message, sessionID );
    else
    if( msgTypeValue == "AT" )
      onMessage( (const AllocationReportAck&)message, sessionID );
    else
    if( msgTypeValue == "AU" )
      onMessage( (const ConfirmationAck&)message, sessionID );
    else
    if( msgTypeValue == "AV" )
      onMessage( (const SettlementInstructionRequest&)message, sessionID );
    else
    if( msgTypeValue == "AW" )
      onMessage( (const AssignmentReport&)message, sessionID );
    else
    if( msgTypeValue == "AX" )
      onMessage( (const CollateralRequest&)message, sessionID );
    else
    if( msgTypeValue == "AY" )
      onMessage( (const CollateralAssignment&)message, sessionID );
    else
    if( msgTypeValue == "AZ" )
      onMessage( (const CollateralResponse&)message, sessionID );
    else
    if( msgTypeValue == "BA" )
      onMessage( (const CollateralReport&)message, sessionID );
    else
    if( msgTypeValue == "BB" )
      onMessage( (const CollateralInquiry&)message, sessionID );
    else
    if( msgTypeValue == "BC" )
      onMessage( (const NetworkCounterpartySystemStatusRequest&)message, sessionID );
    else
    if( msgTypeValue == "BD" )
      onMessage( (const NetworkCounterpartySystemStatusResponse&)message, sessionID );
    else
    if( msgTypeValue == "BE" )
      onMessage( (const UserRequest&)message, sessionID );
    else
    if( msgTypeValue == "BF" )
      onMessage( (const UserResponse&)message, sessionID );
    else
    if( msgTypeValue == "BG" )
      onMessage( (const CollateralInquiryAck&)message, sessionID );
    else
    if( msgTypeValue == "BH" )
      onMessage( (const ConfirmationRequest&)message, sessionID );
    else
    if( msgTypeValue == "BO" )
      onMessage( (const ContraryIntentionReport&)message, sessionID );
    else
    if( msgTypeValue == "BP" )
      onMessage( (const SecurityDefinitionUpdateReport&)message, sessionID );
    else
    if( msgTypeValue == "BK" )
      onMessage( (const SecurityListUpdateReport&)message, sessionID );
    else
    if( msgTypeValue == "BL" )
      onMessage( (const AdjustedPositionReport&)message, sessionID );
    else
    if( msgTypeValue == "BM" )
      onMessage( (const AllocationInstructionAlert&)message, sessionID );
    else
    if( msgTypeValue == "BN" )
      onMessage( (const ExecutionAcknowledgement&)message, sessionID );
    else
    if( msgTypeValue == "BJ" )
      onMessage( (const TradingSessionList&)message, sessionID );
    else
    if( msgTypeValue == "BI" )
      onMessage( (const TradingSessionListRequest&)message, sessionID );
    else onMessage( message, sessionID );
  }